

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t readback_bytes(mime_state *state,char *buffer,size_t bufsize,char *bytes,size_t numbytes,
                     char *trail)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  char *__src;
  ulong uVar4;
  
  sVar1 = curlx_sotouz(state->offset);
  uVar4 = sVar1 - numbytes;
  if (sVar1 < numbytes) {
    uVar3 = numbytes - sVar1;
    __src = bytes + sVar1;
  }
  else {
    sVar2 = strlen(trail);
    uVar3 = sVar2 - uVar4;
    if (sVar2 < uVar4 || uVar3 == 0) {
      return 0;
    }
    __src = trail + uVar4;
  }
  if (uVar3 < bufsize) {
    bufsize = uVar3;
  }
  memcpy(buffer,__src,bufsize);
  state->offset = state->offset + bufsize;
  return bufsize;
}

Assistant:

static size_t readback_bytes(struct mime_state *state,
                             char *buffer, size_t bufsize,
                             const char *bytes, size_t numbytes,
                             const char *trail)
{
  size_t sz;
  size_t offset = curlx_sotouz(state->offset);

  if(numbytes > offset) {
    sz = numbytes - offset;
    bytes += offset;
  }
  else {
    size_t tsz = strlen(trail);

    sz = offset - numbytes;
    if(sz >= tsz)
      return 0;
    bytes = trail + sz;
    sz = tsz - sz;
  }

  if(sz > bufsize)
    sz = bufsize;

  memcpy(buffer, bytes, sz);
  state->offset += sz;
  return sz;
}